

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimera.hpp
# Opt level: O1

ChimeraIndex * __thiscall
openjij::graph::Chimera<double>::to_rci
          (ChimeraIndex *__return_storage_ptr__,Chimera<double> *this,Index ind)

{
  runtime_error *this_00;
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (ind < (this->super_Sparse<double>).super_Graph._num_spins) {
    uVar2 = this->_num_column << 3;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = (ulong)((uint)ind & 7);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>
    ._M_head_impl = ind % uVar2 >> 3;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = ind / uVar2;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,ind);
  std::operator+(&local_40,"invalid value index=",&local_60);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ChimeraIndex to_rci(Index ind) const {
    if (!(ind < this->get_num_spins())) {
      throw std::runtime_error("invalid value index=" + std::to_string(ind) +
                               " inserted in Chimera");
    }

    std::int64_t r = ind / (_num_column * _num_in_chimera);
    ind -= (_num_column * _num_in_chimera) * r;
    std::int64_t c = ind / _num_in_chimera;
    ind -= (_num_in_chimera)*c;
    std::int64_t i = ind;
    return std::make_tuple(r, c, i);
  }